

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_FSA_non.c
# Opt level: O1

void PrintOutputS(N_Vector *uS)

{
  printf("                                Sensitivity 1  ");
  N_VMaxNorm(*uS);
  printf("%12.4e \n");
  printf("                                Sensitivity 2  ");
  N_VMaxNorm(uS[1]);
  printf("%12.4e \n");
  return;
}

Assistant:

static void PrintOutputS(N_Vector* uS)
{
  printf("                                Sensitivity 1  ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le \n", N_VMaxNorm(uS[0]));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e \n", N_VMaxNorm(uS[0]));
#else
  printf("%12.4e \n", N_VMaxNorm(uS[0]));
#endif

  printf("                                Sensitivity 2  ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le \n", N_VMaxNorm(uS[1]));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e \n", N_VMaxNorm(uS[1]));
#else
  printf("%12.4e \n", N_VMaxNorm(uS[1]));
#endif
}